

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O3

int __thiscall
vkt::sr::anon_unknown_0::ConstantDerivateCaseInstance::verify
          (ConstantDerivateCaseInstance *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  DerivateCaseDefinition *pDVar1;
  DerivateCaseValues *pDVar2;
  bool bVar3;
  undefined7 extraout_var;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 local_68 [16];
  Vec4 threshold;
  Vec4 reference;
  
  reference.m_data[0] = 0.0;
  reference.m_data[1] = 0.0;
  reference.m_data[2] = 0.0;
  reference.m_data[3] = 0.0;
  pDVar1 = (this->super_TriangleDerivateCaseInstance).m_definitions;
  TriangleDerivateCaseInstance::getSurfaceThreshold((TriangleDerivateCaseInstance *)local_68);
  pDVar2 = (this->super_TriangleDerivateCaseInstance).m_values;
  auVar5 = *(undefined1 (*) [16])(pDVar2->derivScale).m_data;
  auVar4._0_8_ = auVar5._0_8_ ^ 0x8000000080000000;
  auVar4._8_4_ = auVar5._8_4_ ^ 0x80000000;
  auVar4._12_4_ = auVar5._12_4_ ^ 0x80000000;
  auVar5 = maxps(auVar4,auVar5);
  threshold.m_data = (float  [4])divps(local_68,auVar5);
  bVar3 = verifyConstantDerivate
                    (((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                      super_TestInstance.m_context)->m_testCtx->m_log,(ConstPixelBufferAccess *)ctx,
                     (PixelBufferAccess *)sig,pDVar1->dataType,&reference,&threshold,
                     &pDVar2->derivScale,&pDVar2->derivBias,LOG_ALL);
  return (int)CONCAT71(extraout_var,bVar3);
}

Assistant:

bool ConstantDerivateCaseInstance::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4 reference	(0.0f); // Derivate of constant argument should always be 0
	const tcu::Vec4	threshold	= getSurfaceThreshold() / abs(m_values.derivScale);

	return verifyConstantDerivate(m_context.getTestContext().getLog(), result, errorMask, m_definitions.dataType,
								  reference, threshold, m_values.derivScale, m_values.derivBias);
}